

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_fsync(LIBSSH2_SFTP_HANDLE *hnd)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  LIBSSH2_SFTP_HANDLE *hnd_local;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    hnd_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ = sftp_fsync(hnd);
      if ((entry_time._4_4_ != -0x25) || (hnd->sftp->channel->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(hnd->sftp->channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    hnd_local._4_4_ = entry_time._4_4_;
  }
  return hnd_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fsync(LIBSSH2_SFTP_HANDLE *hnd)
{
    int rc;
    if(!hnd)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_fsync(hnd));
    return rc;
}